

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pullup_set_operation.cpp
# Opt level: O2

void duckdb::ReplaceFilterTableIndex(Expression *expr,LogicalSetOperation *setop)

{
  BoundColumnRefExpression *pBVar1;
  _Any_data local_28;
  code *local_18;
  code *local_10;
  
  if ((expr->super_BaseExpression).type == BOUND_COLUMN_REF) {
    pBVar1 = BaseExpression::Cast<duckdb::BoundColumnRefExpression>(&expr->super_BaseExpression);
    (pBVar1->binding).table_index = setop->table_index;
  }
  else {
    local_28._8_8_ = 0;
    local_10 = ::std::
               _Function_handler<void_(duckdb::Expression_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/optimizer/pullup/pullup_set_operation.cpp:16:46)>
               ::_M_invoke;
    local_18 = ::std::
               _Function_handler<void_(duckdb::Expression_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/optimizer/pullup/pullup_set_operation.cpp:16:46)>
               ::_M_manager;
    local_28._M_unused._M_object = setop;
    ExpressionIterator::EnumerateChildren(expr,(function<void_(duckdb::Expression_&)> *)&local_28);
    ::std::_Function_base::~_Function_base((_Function_base *)&local_28);
  }
  return;
}

Assistant:

static void ReplaceFilterTableIndex(Expression &expr, LogicalSetOperation &setop) {
	if (expr.GetExpressionType() == ExpressionType::BOUND_COLUMN_REF) {
		auto &colref = expr.Cast<BoundColumnRefExpression>();
		D_ASSERT(colref.depth == 0);

		colref.binding.table_index = setop.table_index;
		return;
	}
	ExpressionIterator::EnumerateChildren(expr, [&](Expression &child) { ReplaceFilterTableIndex(child, setop); });
}